

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert_functional.h
# Opt level: O1

void __thiscall
mp::
BasicFCC<mp::FCC<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mp::LinearFunctionalConstraint>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mp::LinearFunctionalConstraint>
::PreprocessArguments
          (BasicFCC<mp::FCC<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mp::LinearFunctionalConstraint>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mp::LinearFunctionalConstraint>
           *this)

{
  double dVar1;
  double dVar2;
  ulong uVar3;
  ulong uVar4;
  PreprocessInfoStd pre;
  PreprocessInfoStd local_28;
  
  BoundComputations<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  ::ComputeBoundsAndType<mp::LinTerms>
            (&local_28,
             (BoundComputations<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
              *)this->converter_,&(this->constr_).affine_expr_);
  dVar1 = (this->prepro_).lb_;
  dVar2 = (this->prepro_).ub_;
  uVar3 = -(ulong)(dVar1 < local_28.lb_);
  uVar4 = -(ulong)(local_28.ub_ < dVar2);
  (this->prepro_).lb_ = (double)(~uVar3 & (ulong)dVar1 | (ulong)local_28.lb_ & uVar3);
  (this->prepro_).ub_ = (double)(~uVar4 & (ulong)dVar2 | (ulong)local_28.ub_ & uVar4);
  (this->prepro_).type_ = local_28.type_;
  return;
}

Assistant:

void PreprocessArguments() {
    GetConverter().PreprocessConstraint(GetConstraint(), prepro_);
  }